

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O3

MaybeResult<wasm::Ok> *
wasm::WATParser::instr<wasm::WATParser::ParseDeclsCtx>
          (MaybeResult<wasm::Ok> *__return_storage_ptr__,ParseDeclsCtx *ctx)

{
  vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_> *__x;
  undefined1 local_40 [8];
  optional<std::basic_string_view<char,_std::char_traits<char>_>_> keyword;
  
  Lexer::peekKeyword((optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)local_40,
                     &ctx->in);
  if (keyword.
      super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
      _M_payload.
      super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
      _M_payload._8_1_ != '\x01') goto switchD_00b8a2ce_caseD_6;
  switch(local_40) {
  case (undefined1  [8])0x3:
    if ((*(char *)(keyword.
                   super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                   ._M_payload.
                   super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                   ._M_payload._M_value._M_len + 2) != 'd' ||
         *(short *)keyword.
                   super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                   ._M_payload.
                   super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                   ._M_payload._M_value._M_len != 0x6e65) &&
       (*(char *)(keyword.
                  super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                  ._M_payload.
                  super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                  ._M_payload._M_value._M_len + 2) != 'f' ||
        *(short *)keyword.
                  super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                  ._M_payload.
                  super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                  ._M_payload._M_value._M_len != 0x6572)) break;
    goto LAB_00b8a401;
  case (undefined1  [8])0x4:
    if ((*(int *)keyword.
                 super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                 ._M_payload.
                 super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                 ._M_payload._M_value._M_len == 0x6e656874) ||
       (*(int *)keyword.
                super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                ._M_payload.
                super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                ._M_payload._M_value._M_len == 0x65736c65)) goto LAB_00b8a401;
    break;
  case (undefined1  [8])0x5:
    if (*(char *)(keyword.
                  super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                  ._M_payload.
                  super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                  ._M_payload._M_value._M_len + 4) == 'h' &&
        *(int *)keyword.
                super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                ._M_payload.
                super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                ._M_payload._M_value._M_len == 0x63746163) goto LAB_00b8a401;
    break;
  case (undefined1  [8])0x8:
    if (*(long *)keyword.
                 super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                 ._M_payload.
                 super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                 ._M_payload._M_value._M_len == 0x65746167656c6564) goto LAB_00b8a401;
    break;
  case (undefined1  [8])0x9:
    if (*(char *)(keyword.
                  super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                  ._M_payload.
                  super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                  ._M_payload._M_value._M_len + 8) == 'l' &&
        *(long *)keyword.
                 super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                 ._M_payload.
                 super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                 ._M_payload._M_value._M_len == 0x6c615f6863746163) goto LAB_00b8a401;
  }
switchD_00b8a2ce_caseD_6:
  __x = &(ctx->in).annotations;
  std::vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>::vector
            ((vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_> *)
             local_40,__x);
  blockinstr<wasm::WATParser::ParseDeclsCtx>
            (__return_storage_ptr__,ctx,
             (vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_> *)
             local_40);
  if (local_40 != (undefined1  [8])0x0) {
    operator_delete((void *)local_40,
                    CONCAT71(keyword.
                             super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                             ._M_payload.
                             super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                             ._M_payload._9_7_,
                             keyword.
                             super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                             ._M_payload.
                             super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                             ._M_payload._8_1_) - (long)local_40);
  }
  if (*(__index_type *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) == '\x01') {
    std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err>::
    ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)
                      __return_storage_ptr__);
    std::vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>::vector
              ((vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_> *)
               local_40,__x);
    plaininstr<wasm::WATParser::ParseDeclsCtx>
              (__return_storage_ptr__,ctx,
               (vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_> *)
               local_40);
    if (local_40 != (undefined1  [8])0x0) {
      operator_delete((void *)local_40,
                      CONCAT71(keyword.
                               super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                               ._M_payload.
                               super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                               ._M_payload._9_7_,
                               keyword.
                               super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                               ._M_payload.
                               super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                               ._M_payload._8_1_) - (long)local_40);
    }
    if (*(__index_type *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) == '\x01') {
      std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)
                        __return_storage_ptr__);
LAB_00b8a401:
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\x01';
    }
  }
  return __return_storage_ptr__;
}

Assistant:

MaybeResult<> instr(Ctx& ctx) {
  // Check for valid strings that are not instructions.
  if (auto keyword = ctx.in.peekKeyword()) {
    if (keyword == "end"sv || keyword == "then"sv || keyword == "else"sv ||
        keyword == "catch"sv || keyword == "catch_all"sv ||
        keyword == "delegate"sv || keyword == "ref"sv) {
      return {};
    }
  }
  if (auto inst = blockinstr(ctx, ctx.in.getAnnotations())) {
    return inst;
  }
  if (auto inst = plaininstr(ctx, ctx.in.getAnnotations())) {
    return inst;
  }
  // TODO: Handle folded plain instructions as well.
  return {};
}